

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLMRegressor.pb.cc
# Opt level: O3

void __thiscall
CoreML::Specification::GLMRegressor::GLMRegressor(GLMRegressor *this,GLMRegressor *from)

{
  int new_size;
  void *pvVar1;
  
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__GLMRegressor_00416958;
  (this->_internal_metadata_).
  super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
  .ptr_ = (void *)0x0;
  (this->weights_).super_RepeatedPtrFieldBase.arena_ = (Arena *)0x0;
  (this->weights_).super_RepeatedPtrFieldBase.current_size_ = 0;
  (this->weights_).super_RepeatedPtrFieldBase.total_size_ = 0;
  (this->weights_).super_RepeatedPtrFieldBase.rep_ = (Rep *)0x0;
  google::protobuf::internal::RepeatedPtrFieldBase::
  MergeFrom<google::protobuf::RepeatedPtrField<CoreML::Specification::GLMRegressor_DoubleArray>::TypeHandler>
            (&(this->weights_).super_RepeatedPtrFieldBase,
             &(from->weights_).super_RepeatedPtrFieldBase);
  (this->offset_).current_size_ = 0;
  (this->offset_).total_size_ = 0;
  (this->offset_).rep_ = (Rep *)0x0;
  new_size = (from->offset_).current_size_;
  if (new_size != 0) {
    google::protobuf::RepeatedField<double>::Reserve(&this->offset_,new_size);
    memcpy(((this->offset_).rep_)->elements,((from->offset_).rep_)->elements,
           (long)(from->offset_).current_size_ << 3);
    (this->offset_).current_size_ = (from->offset_).current_size_;
  }
  this->_cached_size_ = 0;
  pvVar1 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           .ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,(string *)((ulong)pvVar1 & 0xfffffffffffffffe));
  }
  this->postevaluationtransform_ = from->postevaluationtransform_;
  return;
}

Assistant:

GLMRegressor::GLMRegressor(const GLMRegressor& from)
  : ::google::protobuf::MessageLite(),
      _internal_metadata_(NULL),
      weights_(from.weights_),
      offset_(from.offset_),
      _cached_size_(0) {
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  postevaluationtransform_ = from.postevaluationtransform_;
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.GLMRegressor)
}